

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O1

void __thiscall QList<QList<QString>_>::clear(QList<QList<QString>_> *this)

{
  Data *pDVar1;
  QList<QString> *pQVar2;
  longlong lVar3;
  QArrayDataPointer<QString> *this_00;
  long lVar4;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QList<QString>_> local_48;
  QArrayData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (this->d).size;
  if (lVar4 != 0) {
    pDVar1 = (this->d).d;
    if ((pDVar1 == (Data *)0x0) ||
       (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (QList<QString> *)&DAT_aaaaaaaaaaaaaaaa;
      if (pDVar1 == (Data *)0x0) {
        lVar3 = 0;
      }
      else {
        lVar3 = (pDVar1->super_QArrayData).alloc;
      }
      local_28 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar2 = (QList<QString> *)QArrayData::allocate(&local_28,0x18,0x10,lVar3,KeepSize);
      local_48.d = (this->d).d;
      local_48.ptr = (this->d).ptr;
      (this->d).d = (Data *)local_28;
      (this->d).ptr = pQVar2;
      local_48.size = (this->d).size;
      (this->d).size = 0;
      QArrayDataPointer<QList<QString>_>::~QArrayDataPointer(&local_48);
    }
    else {
      this_00 = &((this->d).ptr)->d;
      lVar4 = lVar4 * 0x18;
      do {
        QArrayDataPointer<QString>::~QArrayDataPointer(this_00);
        this_00 = this_00 + 1;
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
      (this->d).size = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }